

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O0

vec3f Transformed::transformedDir(mat4f *mat,vec3f *v)

{
  vec3f *in_RSI;
  vec4f *in_RDI;
  vec3f vVar1;
  vec3f *in_stack_ffffffffffffff80;
  vec4f local_50;
  vec4f *local_40;
  vec4f *b;
  mat4f *in_stack_ffffffffffffffd0;
  
  b = local_40;
  vec4f::vec4f(&local_50,in_RSI,0.0);
  _local_40 = ::operator*(in_stack_ffffffffffffffd0,b);
  vec4f::xyz(in_RDI);
  vVar1 = normalized(in_stack_ffffffffffffff80);
  return vVar1;
}

Assistant:

static vec3f transformedDir(const mat4f& mat, const vec3f& v) {
		return normalized((mat * vec4f(v, 0)).xyz());
	}